

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O0

void visceral_four(CHAR_DATA *ch)

{
  bool bVar1;
  long in_RDI;
  AFFECT_DATA af;
  CHAR_DATA *mob;
  undefined1 in_stack_000012d2;
  undefined1 in_stack_000012d3;
  int in_stack_000012d4;
  int in_stack_000012d8;
  int in_stack_000012dc;
  CHAR_DATA *in_stack_000012e0;
  CHAR_DATA *in_stack_000012e8;
  int in_stack_00001308;
  int in_stack_00001310;
  char *in_stack_00001318;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  AFFECT_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *in_stack_ffffffffffffff80;
  long local_10;
  
  if ((*(byte *)(in_RDI + 0x32c) & 1) == 0) {
    if (*(long *)(in_RDI + 0x20) == 0) {
      act(in_stack_ffffffffffffff70,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
          (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
          (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
      act(in_stack_ffffffffffffff70,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
          (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
          (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
      init_affect((AFFECT_DATA *)0x6c8551);
      skill_lookup((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      new_affect_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      new_affect_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      for (local_10 = *(long *)(*(long *)(in_RDI + 0xa8) + 0x18); local_10 != 0;
          local_10 = *(long *)(local_10 + 8)) {
        bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        if ((((bVar1) &&
             (bVar1 = is_affected_by((CHAR_DATA *)
                                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                     in_stack_ffffffffffffff64), bVar1)) &&
            (*(long *)(local_10 + 0x10) != 0)) && (*(long *)(local_10 + 0x10) == in_RDI)) {
          affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (AFFECT_DATA *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          act(in_stack_ffffffffffffff70,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
              (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
              (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
        }
      }
    }
    else {
      send_to_char(in_stack_ffffffffffffff70,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      send_to_char(in_stack_ffffffffffffff70,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      act(in_stack_ffffffffffffff70,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
          (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
          (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
      dice(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      damage_new(in_stack_000012e8,in_stack_000012e0,in_stack_000012dc,in_stack_000012d8,
                 in_stack_000012d4,(bool)in_stack_000012d3,(bool)in_stack_000012d2,in_stack_00001308
                 ,in_stack_00001310,in_stack_00001318);
    }
  }
  return;
}

Assistant:

void visceral_four(CHAR_DATA *ch)
{
	CHAR_DATA *mob;
	AFFECT_DATA af;

	if (ch->disrupted)
		return;

	if (ch->fighting)
	{
		send_to_char("The unseen dark powers howl in fury at the disruption!\n\r", ch);
		send_to_char("Invisible claws rend at your flesh as they seek to sate their bloodthirst!\n\r", ch);

		act("Swirling shadows surround $n, tearing at his flesh as $e shrieks in agony!", ch, nullptr, nullptr, TO_ROOM);

		damage_new(ch, ch, dice(30, 40), gsn_unholy_bond, DAM_TRUESTRIKE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the unholy assault*");
		return;
	}

	act("Emerging from this loathsome orgy, $n and $s creatures surge with new strength.", ch, 0, 0, TO_ROOM);
	act("Emerging from this loathsome orgy, you feel new strength surge through you.", ch, 0, 0, TO_CHAR);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = skill_lookup("visceral divination");
	af.aftype = AFT_SPELL;
	af.level = ch->level;
	af.duration = 60;
	af.owner = ch;
	af.end_fun = nullptr;
	af.location = APPLY_HIT;
	af.modifier = ch->level * 8;
	new_affect_to_char(ch, &af);

	af.location = APPLY_NONE;
	af.modifier = 0;
	new_affect_to_char(ch, &af);

	for (mob = ch->in_room->people; mob != nullptr; mob = mob->next_in_room)
	{
		if (is_npc(mob) && is_affected_by(mob, AFF_CHARM) && mob->master && mob->master == ch)
		{
			af.location = APPLY_DAMROLL;
			af.modifier = (ch->level / 2) - 5;
			affect_to_char(mob, &af);
			act("$n's eyes glow with unholy fervor.", mob, 0, 0, TO_ROOM);
		}
	}
}